

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O0

void __thiscall
slang::ast::PatternCaseStatement::visitStmts<hgdb::rtl::Serializer&>
          (PatternCaseStatement *this,Serializer *visitor)

{
  iterator pIVar1;
  Statement *this_00;
  ItemGroup *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL> *__range3;
  Serializer *visitor_local;
  PatternCaseStatement *this_local;
  
  __end3 = nonstd::span_lite::
           span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>::begin
                     (&this->items);
  pIVar1 = nonstd::span_lite::
           span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>::end
                     (&this->items);
  for (; __end3 != pIVar1; __end3 = __end3 + 1) {
    this_00 = not_null<const_slang::ast::Statement_*>::operator->(&__end3->stmt);
    Statement::visit<hgdb::rtl::Serializer&>(this_00,visitor);
  }
  if (this->defaultCase != (Statement *)0x0) {
    Statement::visit<hgdb::rtl::Serializer&>(this->defaultCase,visitor);
  }
  return;
}

Assistant:

void visitStmts(TVisitor&& visitor) const {
        for (auto& item : items)
            item.stmt->visit(visitor);
        if (defaultCase)
            defaultCase->visit(visitor);
    }